

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_joystick_events.c
# Opt level: O1

void setup_joystick_values(ALLEGRO_JOYSTICK *joy)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int *piVar6;
  ALLEGRO_JOYSTICK_STATE jst;
  undefined1 local_168 [192];
  int aiStack_a8 [32];
  
  if (joy != (ALLEGRO_JOYSTICK *)0x0) {
    al_get_joystick_state(joy,local_168);
    iVar1 = al_get_joystick_num_sticks(joy);
    num_sticks = 0x10;
    if (iVar1 < 0x10) {
      num_sticks = iVar1;
    }
    if (0 < iVar1) {
      piVar6 = num_axes;
      lVar4 = 0;
      uVar5 = 0;
      do {
        uVar2 = al_get_joystick_num_axes(joy,uVar5 & 0xffffffff);
        *piVar6 = uVar2;
        if (0 < (int)uVar2) {
          memcpy((void *)((long)joys[0] + lVar4),local_168 + lVar4,(ulong)uVar2 << 2);
        }
        uVar5 = uVar5 + 1;
        piVar6 = (int *)((uint *)piVar6 + 1);
        lVar4 = lVar4 + 0xc;
      } while ((long)uVar5 < (long)num_sticks);
    }
    uVar2 = al_get_joystick_num_buttons(joy);
    num_buttons = 0x20;
    if ((int)uVar2 < 0x20) {
      num_buttons = uVar2;
    }
    if (0 < (int)uVar2) {
      uVar5 = (ulong)(uint)num_buttons;
      uVar3 = 0;
      do {
        joys_buttons[uVar3] = 0x3fff < aiStack_a8[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
    return;
  }
  num_sticks = 0;
  num_buttons = 0;
  return;
}

Assistant:

static void setup_joystick_values(ALLEGRO_JOYSTICK *joy)
{
   ALLEGRO_JOYSTICK_STATE jst;
   int i, j;

   if (joy == NULL) {
      num_sticks = 0;
      num_buttons = 0;
      return;
   }

   al_get_joystick_state(joy, &jst);

   num_sticks = al_get_joystick_num_sticks(joy);
   if (num_sticks > MAX_STICKS)
      num_sticks = MAX_STICKS;
   for (i = 0; i < num_sticks; i++) {
      num_axes[i] = al_get_joystick_num_axes(joy, i);
      for (j = 0; j < num_axes[i]; ++j)
         joys[i][j] = jst.stick[i].axis[j];
   }

   num_buttons = al_get_joystick_num_buttons(joy);
   if (num_buttons > MAX_BUTTONS) {
      num_buttons = MAX_BUTTONS;
   }
   for (i = 0; i < num_buttons; i++) {
      joys_buttons[i] = (jst.button[i] >= 16384);
   }
}